

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_flip_vertical_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  size_t __n;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    iVar2 = rf_bits_per_pixel(image.format);
    iVar2 = iVar2 * image.height * image.width;
    iVar3 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar3 >> 3 <= dst_size) {
      if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        __n = *(size_t *)(&DAT_0017a6c8 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
      }
      else {
        __n = 0;
      }
      if (0 < image.height) {
        lVar4 = __n * (long)image.width;
        pvVar6 = (void *)((ulong)(image.height - 1) * lVar4 + (long)image.data);
        lVar9 = 0;
        pvVar8 = dst;
        do {
          if (0 < image.width) {
            lVar5 = 0;
            lVar7 = (long)image.width;
            do {
              memcpy((void *)(lVar5 + (long)pvVar8),(void *)(lVar5 + (long)pvVar6),__n);
              lVar5 = lVar5 + __n;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          lVar9 = lVar9 + 1;
          pvVar6 = (void *)((long)pvVar6 - lVar4);
          pvVar8 = (void *)((long)pvVar8 + lVar4);
        } while (lVar9 != image.height);
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = (int)image._8_8_;
      __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      __return_storage_ptr__->format = (int)uVar1;
      __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_flip_vertical_to_buffer(rf_image image, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    void* dst_pixel = ((unsigned char*)dst) + (y * image.width + x) * bpp;
                    void* src_pixel = ((unsigned char*)image.data) + ((image.height - 1 - y) * image.width + x) * bpp;

                    memcpy(dst_pixel, src_pixel, bpp);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}